

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

bool __thiscall slang::parsing::Parser::isLocalVariableDeclaration(Parser *this)

{
  bool bVar1;
  TokenKind TVar2;
  uint in_EAX;
  uint uVar3;
  ulong uVar4;
  Token TVar5;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  TVar5 = ParserBase::peek(&this->super_ParserBase,0);
  TVar2 = TVar5.kind;
  uVar4 = (ulong)(TVar2 - 0x113);
  if (TVar2 - 0x113 < 0x33) {
    if ((0x2000403UL >> (uVar4 & 0x3f) & 1) != 0) goto LAB_0034dc04;
    if ((0x5008000004000U >> (uVar4 & 0x3f) & 1) != 0) {
      return true;
    }
    if (uVar4 == 0x25) {
      TVar5 = ParserBase::peek(&this->super_ParserBase,1);
      if (TVar5.kind != OpenParenthesis) {
        return false;
      }
      uStack_18 = CONCAT44(2,(undefined4)uStack_18);
      bVar1 = scanTypePart<&slang::syntax::SyntaxFacts::isNotInType>
                        (this,(uint32_t *)((long)&uStack_18 + 4),OpenParenthesis,CloseParenthesis);
      goto LAB_0034dbea;
    }
  }
  if ((TVar2 - 0xc5 < 0x3d) && ((0x160000000000c003U >> ((ulong)(TVar2 - 0xc5) & 0x3f) & 1) != 0)) {
LAB_0034dc04:
    TVar5 = ParserBase::peek(&this->super_ParserBase,1);
    return (ushort)(TVar5.kind - OpenBrace) < 0xfffe;
  }
  uVar3 = TVar2 - 0x6d;
  if (uVar3 < 0x36) {
    if ((0x30000000000400U >> ((ulong)uVar3 & 0x3f) & 1) != 0) {
      return true;
    }
    if ((0x21UL >> ((ulong)uVar3 & 0x3f) & 1) != 0) goto LAB_0034dc04;
  }
  bVar1 = scanQualifiedName(this,(uint32_t *)((long)&uStack_18 + 4),false);
  if (!bVar1) {
    return false;
  }
  bVar1 = scanDimensionList(this,(uint32_t *)((long)&uStack_18 + 4));
LAB_0034dbea:
  if (bVar1 == false) {
    return false;
  }
  TVar5 = ParserBase::peek(&this->super_ParserBase,uStack_18._4_4_);
  return TVar5.kind == Identifier;
}

Assistant:

bool Parser::isLocalVariableDeclaration() {
    uint32_t index = 0;
    auto kind = peek(index).kind;
    switch (kind) {
        case TokenKind::VarKeyword:
        case TokenKind::CHandleKeyword:
        case TokenKind::EventKeyword:
        case TokenKind::StructKeyword:
        case TokenKind::UnionKeyword:
        case TokenKind::EnumKeyword:
        case TokenKind::VirtualKeyword:
            return true;

        // some cases might be a cast expression
        case TokenKind::StringKeyword:
        case TokenKind::BitKeyword:
        case TokenKind::LogicKeyword:
        case TokenKind::RegKeyword:
        case TokenKind::ByteKeyword:
        case TokenKind::ShortIntKeyword:
        case TokenKind::IntKeyword:
        case TokenKind::LongIntKeyword:
        case TokenKind::IntegerKeyword:
        case TokenKind::TimeKeyword:
        case TokenKind::ShortRealKeyword:
        case TokenKind::RealKeyword:
        case TokenKind::RealTimeKeyword: {
            auto next = peek(++index).kind;
            return next != TokenKind::Apostrophe && next != TokenKind::ApostropheOpenBrace;
        }

        // if this is the type operator it's technically not allowed to be a variable
        // declaration without a "var" prefix, but we'll try to allow it anyway and
        // diagnose it later with a better error message.
        case TokenKind::TypeKeyword: {
            if (peek(++index).kind != TokenKind::OpenParenthesis)
                return false;

            index++;
            if (!scanTypePart<isNotInType>(index, TokenKind::OpenParenthesis,
                                           TokenKind::CloseParenthesis)) {
                return false;
            }
            return peek(index).kind == TokenKind::Identifier;
        }

        default:
            break;
    }

    if (!scanQualifiedName(index, /* allowNew */ false))
        return false;

    // might be a list of dimensions here
    if (!scanDimensionList(index))
        return false;

    // next token is the decider; declarations must have an identifier here
    return peek(index).kind == TokenKind::Identifier;
}